

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O0

void __thiscall OpenMesh::PropertyT<int>::clear(PropertyT<int> *this)

{
  vector<int,_std::allocator<int>_> local_28;
  PropertyT<int> *local_10;
  PropertyT<int> *this_local;
  
  local_10 = this;
  std::vector<int,_std::allocator<int>_>::clear(&this->data_);
  memset(&local_28,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector(&local_28);
  std::vector<int,_std::allocator<int>_>::swap(&local_28,&this->data_);
  std::vector<int,_std::allocator<int>_>::~vector(&local_28);
  return;
}

Assistant:

virtual void clear()  { data_.clear(); vector_type().swap(data_);    }